

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 *puVar3;
  int iVar4;
  UnitTestSource *pUVar5;
  Variable *pVVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_589;
  AssertionResult local_588;
  AssertionHelper local_560;
  undefined1 local_530 [392];
  int local_3a8;
  undefined1 local_3a0 [396];
  int local_214;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_214 = argc;
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar5);
  iutest::TestEnv::ParseCommandLine<char>(&local_214,argv);
  iutest::TestEnv::LoadFlagFile();
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar5);
  pVVar6 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530,(pVVar6->m_output_option).m_value._M_dataplus._M_p,
             (allocator<char> *)local_3a0);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             *)local_530,"junit:test.xml");
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
  }
  pVVar6 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530,(pVVar6->m_test_filter)._M_dataplus._M_p,
             (allocator<char> *)local_3a0);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            local_530,"-*Fail*");
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
  }
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar4 = iutest::UnitTestSource::Run(pUVar5);
  iVar7 = 0;
  if (iVar4 == 0) {
    pVVar6 = iutest::TestEnv::get_vars();
    iutest::internal::CmpHelperEQ<char[9],std::__cxx11::string>
              (&local_588,(internal *)"\"test.xml\"",
               "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
               ,"test.xml",(char (*) [9])((pVVar6->m_event_listeners).m_default_xml_generator + 5),
               in_R9);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x8c;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    paVar1 = &local_588.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1324fb,0);
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&local_588,(internal *)"::std::string::npos","FileIO::s_io.find(\"Fail\")",
               (char *)&std::__cxx11::string::npos,(unsigned_long *)local_530,(unsigned_long *)in_R9
              );
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_50);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x8d;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x132524,0);
    puVar3 = std::__cxx11::string::npos;
    if (std::__cxx11::string::npos == (undefined1 *)local_530._0_8_) {
      main_cold_1();
    }
    else {
      local_588.m_message._M_string_length = 0;
      local_588.m_message.field_2._M_local_buf[0] = '\0';
      local_588.m_result = true;
      local_588.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_70);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x8f;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1322a9,0);
    if (puVar3 == (undefined1 *)local_530._0_8_) {
      main_cold_2();
    }
    else {
      local_588.m_message._M_string_length = 0;
      local_588.m_message.field_2._M_local_buf[0] = '\0';
      local_588.m_result = true;
      local_588.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_90);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x91;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1322e9,0);
    if (puVar3 == (undefined1 *)local_530._0_8_) {
      main_cold_3();
    }
    else {
      local_588.m_message._M_string_length = 0;
      local_588.m_message.field_2._M_local_buf[0] = '\0';
      local_588.m_result = true;
      local_588.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_b0);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x93;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x132334,0);
    iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
              (&local_588,"::std::string::npos",
               "FileIO::s_io.find(\"<property name=\\\"fixture\\\" value=\\\"1\\\"\" )",
               (unsigned_long *)&std::__cxx11::string::npos,(unsigned_long *)local_530);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_d0);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x96;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x132392,0);
    iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
              (&local_588,"::std::string::npos",
               "FileIO::s_io.find(\"<property name=\\\"type_param\\\" value=\" )",
               (unsigned_long *)&std::__cxx11::string::npos,(unsigned_long *)local_530);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_f0);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x99;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1323f1,0);
    iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
              (&local_588,"::std::string::npos",
               "FileIO::s_io.find(\"<property name=\\\"Test/0\\\" value=\\\"0\\\"\" )",
               (unsigned_long *)&std::__cxx11::string::npos,(unsigned_long *)local_530);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_110);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x9d;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x132450,0);
    iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
              (&local_588,"::std::string::npos",
               "FileIO::s_io.find(\"<property name=\\\"Test/1\\\" value=\\\"10\\\"\" )",
               (unsigned_long *)&std::__cxx11::string::npos,(unsigned_long *)local_530);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_130);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0x9f;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b03d;
    FileIO::s_io_abi_cxx11_._M_string_length = 0;
    *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
    bVar2 = true;
  }
  else {
    iVar7 = 1;
LAB_0011b03d:
    bVar2 = false;
  }
  if (!bVar2) {
    return iVar7;
  }
  pVVar6 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530,(pVVar6->m_output_option).m_value._M_dataplus._M_p,
             (allocator<char> *)local_3a0);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             *)local_530,"junit");
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
  }
  pVVar6 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530,(pVVar6->m_test_filter)._M_dataplus._M_p,
             (allocator<char> *)local_3a0);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            local_530,"*Fail*");
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
  }
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar4 = iutest::UnitTestSource::Run(pUVar5);
  if (iVar4 == 0) {
    iVar7 = 1;
LAB_0011b595:
    bVar2 = false;
  }
  else {
    pVVar6 = iutest::TestEnv::get_vars();
    iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              (&local_588,(internal *)"::iutest::detail::kStrings::DefaultXmlReportFileName",
               "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
               ,(char *)&iutest::detail::kStrings::DefaultXmlReportFileName,
               (char **)((pVVar6->m_event_listeners).m_default_xml_generator + 5),in_R9);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0xb0;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    paVar1 = &local_588.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b595;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1324fb,0);
    if (std::__cxx11::string::npos == (undefined1 *)local_530._0_8_) {
      main_cold_4();
    }
    else {
      local_588.m_message._M_string_length = 0;
      local_588.m_message.field_2._M_local_buf[0] = '\0';
      local_588.m_result = true;
      local_588.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_150);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0xb1;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b595;
    local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x132524,0);
    iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&local_588,(internal *)"::std::string::npos","FileIO::s_io.find(\"Foo\" )",
               (char *)&std::__cxx11::string::npos,(unsigned_long *)local_530,(unsigned_long *)in_R9
              );
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                 FileIO::s_io_abi_cxx11_._M_dataplus._M_p + FileIO::s_io_abi_cxx11_._M_string_length
                );
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_170);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0xb3;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) goto LAB_0011b595;
    FileIO::s_io_abi_cxx11_._M_string_length = 0;
    *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
    bVar2 = true;
  }
  if (!bVar2) {
    return iVar7;
  }
  pVVar6 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530,(pVVar6->m_default_package_name)._M_dataplus._M_p,
             (allocator<char> *)local_3a0);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
  ::operator=((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
               *)local_530,"root");
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
  }
  pVVar6 = iutest::TestEnv::get_vars();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_530,(pVVar6->m_test_filter)._M_dataplus._M_p,
             (allocator<char> *)local_3a0);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            local_530,(char *)0x0);
  if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
    operator_delete((void *)local_530._0_8_,local_530._16_8_ + 1);
  }
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar4 = iutest::UnitTestSource::Run(pUVar5);
  if (iVar4 == 0) {
    iVar7 = 1;
  }
  else {
    pVVar6 = iutest::TestEnv::get_vars();
    iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
              (&local_588,(internal *)"::iutest::detail::kStrings::DefaultXmlReportFileName",
               "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
               ,(char *)&iutest::detail::kStrings::DefaultXmlReportFileName,
               (char **)((pVVar6->m_event_listeners).m_default_xml_generator + 5),in_R9);
    bVar2 = local_588.m_result;
    if (local_588.m_result == false) {
      memset((iu_global_format_stringstream *)local_3a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_3a0);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
      local_3a8 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
      local_560.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
      ;
      local_560.m_part_result.super_iuCodeMessage.m_line = 0xc1;
      local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
      iVar7 = local_3a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
      std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
      std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
    }
    paVar1 = &local_588.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_588.m_message._M_dataplus._M_p,
                      CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                               local_588.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 != false) {
      local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1324cd,0);
      puVar3 = std::__cxx11::string::npos;
      if (std::__cxx11::string::npos == (undefined1 *)local_530._0_8_) {
        main_cold_5();
      }
      else {
        local_588.m_message._M_string_length = 0;
        local_588.m_message.field_2._M_local_buf[0] = '\0';
        local_588.m_result = true;
        local_588.m_message._M_dataplus._M_p = (pointer)paVar1;
      }
      bVar2 = local_588.m_result;
      if (local_588.m_result == false) {
        memset((iu_global_format_stringstream *)local_3a0,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_3a0);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                   FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                   FileIO::s_io_abi_cxx11_._M_string_length);
        iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_190);
        iutest::detail::iuStreamMessage::iuStreamMessage
                  ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
        local_3a8 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
        local_560.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
        ;
        local_560.m_part_result.super_iuCodeMessage.m_line = 0xc2;
        local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
        iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
        iVar7 = local_3a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
        std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
        std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_588.m_message._M_dataplus._M_p,
                        CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_588.m_message.field_2._M_local_buf[0]) + 1);
      }
      if (bVar2 != false) {
        local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1324f6,0);
        if (puVar3 == (undefined1 *)local_530._0_8_) {
          main_cold_6();
        }
        else {
          local_588.m_message._M_string_length = 0;
          local_588.m_message.field_2._M_local_buf[0] = '\0';
          local_588.m_result = true;
          local_588.m_message._M_dataplus._M_p = (pointer)paVar1;
        }
        bVar2 = local_588.m_result;
        if (local_588.m_result == false) {
          memset((iu_global_format_stringstream *)local_3a0,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_3a0);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                     FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                     FileIO::s_io_abi_cxx11_._M_string_length);
          iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_1b0);
          iutest::detail::iuStreamMessage::iuStreamMessage
                    ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
          local_3a8 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
          local_560.m_part_result.super_iuCodeMessage.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
          ;
          local_560.m_part_result.super_iuCodeMessage.m_line = 0xc4;
          local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
          iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
          iVar7 = local_3a8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
              &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
            operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                            local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                            _M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
          std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
          std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_588.m_message._M_dataplus._M_p,
                          CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                                   local_588.m_message.field_2._M_local_buf[0]) + 1);
        }
        if (bVar2 != false) {
          local_530._0_8_ = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x13251f,0);
          iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                    (&local_588,"::std::string::npos","FileIO::s_io.find(\"root.Foo\" )",
                     (unsigned_long *)&std::__cxx11::string::npos,(unsigned_long *)local_530);
          bVar2 = local_588.m_result;
          if (local_588.m_result == false) {
            memset((iu_global_format_stringstream *)local_3a0,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_3a0);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                       FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                       FileIO::s_io_abi_cxx11_._M_string_length);
            iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_1d0);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
            local_3a8 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
            local_560.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
            ;
            local_560.m_part_result.super_iuCodeMessage.m_line = 0xc6;
            local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
            iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
            iVar7 = local_3a8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ,local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
            std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
            std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_588.m_message._M_dataplus._M_p,
                            CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_588.m_message.field_2._M_local_buf[0]) + 1);
          }
          if (bVar2 != false) {
            local_530._0_8_ =
                 std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x132547,0);
            iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      (&local_588,(internal *)"::std::string::npos",
                       "FileIO::s_io.find(\"root.Bar\" )",(char *)&std::__cxx11::string::npos,
                       (unsigned_long *)local_530,(unsigned_long *)in_R9);
            bVar2 = local_588.m_result;
            if (local_588.m_result == false) {
              memset((iu_global_format_stringstream *)local_3a0,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_3a0);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f0,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                         FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                         FileIO::s_io_abi_cxx11_._M_string_length);
              iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_1f0);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
              local_3a8 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
              local_560.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
              ;
              local_560.m_part_result.super_iuCodeMessage.m_line = 200;
              local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
              iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
              iVar7 = local_3a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                  &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
                operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p,local_560.m_part_result.super_iuCodeMessage.m_message.field_2.
                                     _M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
              std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
              std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588.m_message._M_dataplus._M_p != paVar1) {
              operator_delete(local_588.m_message._M_dataplus._M_p,
                              CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                                       local_588.m_message.field_2._M_local_buf[0]) + 1);
            }
            if (bVar2 != false) {
              local_530._0_8_ =
                   std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x13256f,0);
              iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                        (&local_588,"::std::string::npos","FileIO::s_io.find(\"test.Foo\" )",
                         (unsigned_long *)&std::__cxx11::string::npos,(unsigned_long *)local_530);
              bVar2 = local_588.m_result;
              if (local_588.m_result == false) {
                memset((iu_global_format_stringstream *)local_3a0,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          ((iu_global_format_stringstream *)local_3a0);
                local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_210,FileIO::s_io_abi_cxx11_._M_dataplus._M_p,
                           FileIO::s_io_abi_cxx11_._M_dataplus._M_p +
                           FileIO::s_io_abi_cxx11_._M_string_length);
                iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_3a0,&local_210)
                ;
                iutest::detail::iuStreamMessage::iuStreamMessage
                          ((iuStreamMessage *)local_530,(iuStreamMessage *)local_3a0);
                local_3a8 = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_560,local_588.m_message._M_dataplus._M_p,&local_589);
                local_560.m_part_result.super_iuCodeMessage.m_file =
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                ;
                local_560.m_part_result.super_iuCodeMessage.m_line = 0xcb;
                local_560.m_part_result.super_iuCodeMessage._44_4_ = 2;
                iutest::AssertionHelper::OnFixed(&local_560,(Fixed *)local_530,false);
                iVar7 = local_3a8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                    &local_560.m_part_result.super_iuCodeMessage.m_message.field_2) {
                  operator_delete(local_560.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p,local_560.m_part_result.super_iuCodeMessage.m_message.field_2
                                       ._M_allocated_capacity + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_530);
                std::ios_base::~ios_base((ios_base *)(local_530 + 0x80));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_3a0);
                std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x80));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588.m_message._M_dataplus._M_p != paVar1) {
                operator_delete(local_588.m_message._M_dataplus._M_p,
                                CONCAT71(local_588.m_message.field_2._M_allocated_capacity._1_7_,
                                         local_588.m_message.field_2._M_local_buf[0]) + 1);
              }
              if (bVar2 != false) {
                FileIO::s_io_abi_cxx11_._M_string_length = 0;
                *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
                bVar2 = true;
                goto LAB_0011bfe1;
              }
            }
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_0011bfe1:
  if (bVar2) {
    puts("*** Successful ***");
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
#if OUTPUT_JUNIT_XML_TEST
    IUTEST_INIT(&argc, argv);

    ::iutest::IUTEST_FLAG(output) = "junit:test.xml";

    {
        ::iutest::IUTEST_FLAG(filter) = "-*Fail*";
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;

        IUTEST_ASSERT_EQ( "test.xml"
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<skipped type=\"iutest.skip\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("disabled test" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"fixture\" value=\"1\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if IUTEST_HAS_TYPED_TEST
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"type_param\" value=" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif
#if IUTEST_HAS_PARAM_TEST
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"Test/0\" value=\"0\""  ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"Test/1\" value=\"10\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif
#endif

        FileIO::s_io.clear();
    }

    ::iutest::IUTEST_FLAG(output) = "junit";
    {
        ::iutest::IUTEST_FLAG(filter) = "*Fail*";
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret == 0 ) return 1;
        IUTEST_ASSERT_EQ( ::iutest::detail::kStrings::DefaultXmlReportFileName
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);

        FileIO::s_io.clear();
    }
    {
        ::iutest::IUTEST_FLAG(default_package_name) = "root";
        ::iutest::IUTEST_FLAG(filter) = NULL;
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret == 0 ) return 1;
        IUTEST_ASSERT_EQ( ::iutest::detail::kStrings::DefaultXmlReportFileName
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Test" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("root.Bar" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if IUTEST_HAS_PACKAGE
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("test.Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif

        FileIO::s_io.clear();
    }
    printf("*** Successful ***\n");
#else
    (void)argc;
    (void)argv;
    printf("*** OUTPUT_JUNIT_XML_TEST=0 ***\n");
#endif
    return 0;
}